

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::LogButtons(void)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ImGuiContext *g;
  float v_f;
  ImVec2 local_30;
  
  pIVar3 = GImGui;
  PushID("LogButtons");
  local_30.x = 0.0;
  local_30.y = 0.0;
  bVar5 = ButtonEx("Log To TTY",&local_30,0);
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  if (pIVar2->SkipItems == false) {
    (pIVar2->DC).CursorPos.x = (pIVar4->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
    (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
    (pIVar2->DC).CurrentLineHeight = (pIVar2->DC).PrevLineHeight;
    (pIVar2->DC).CurrentLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
  }
  local_30.x = 0.0;
  local_30.y = 0.0;
  bVar6 = ButtonEx("Log To File",&local_30,0);
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  if (pIVar2->SkipItems == false) {
    (pIVar2->DC).CursorPos.x = (pIVar4->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
    (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
    (pIVar2->DC).CurrentLineHeight = (pIVar2->DC).PrevLineHeight;
    (pIVar2->DC).CurrentLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
  }
  local_30.x = 0.0;
  local_30.y = 0.0;
  bVar7 = ButtonEx("Log To Clipboard",&local_30,0);
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  if (pIVar2->SkipItems == false) {
    (pIVar2->DC).CursorPos.x = (pIVar4->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
    (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
    (pIVar2->DC).CurrentLineHeight = (pIVar2->DC).PrevLineHeight;
    (pIVar2->DC).CurrentLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
  }
  PushItemWidth(80.0);
  PushItemFlag(1,false);
  local_30.x = (float)pIVar3->LogAutoExpandMaxDepth;
  SliderFloat("Depth",&local_30.x,0.0,9.0,"%.0f",1.0);
  pIVar3->LogAutoExpandMaxDepth = (int)local_30.x;
  PopItemFlag();
  PopItemWidth();
  PopID();
  pIVar4 = GImGui;
  if ((bVar5) && (GImGui->LogEnabled == false)) {
    iVar1 = pIVar3->LogAutoExpandMaxDepth;
    pIVar2 = GImGui->CurrentWindow;
    GImGui->LogEnabled = true;
    pIVar4->LogFile = _stdout;
    pIVar4->LogStartDepth = (pIVar2->DC).TreeDepth;
    if (-1 < iVar1) {
      pIVar4->LogAutoExpandMaxDepth = iVar1;
    }
  }
  if (bVar6) {
    LogToFile(pIVar3->LogAutoExpandMaxDepth,(pIVar3->IO).LogFilename);
  }
  pIVar4 = GImGui;
  if ((bVar7) && (GImGui->LogEnabled == false)) {
    iVar1 = pIVar3->LogAutoExpandMaxDepth;
    pIVar2 = GImGui->CurrentWindow;
    GImGui->LogEnabled = true;
    pIVar4->LogFile = (FILE *)0x0;
    pIVar4->LogStartDepth = (pIVar2->DC).TreeDepth;
    if (-1 < iVar1) {
      pIVar4->LogAutoExpandMaxDepth = iVar1;
    }
  }
  return;
}

Assistant:

void ImGui::LogButtons()
{
    ImGuiContext& g = *GImGui;

    PushID("LogButtons");
    const bool log_to_tty = Button("Log To TTY"); SameLine();
    const bool log_to_file = Button("Log To File"); SameLine();
    const bool log_to_clipboard = Button("Log To Clipboard"); SameLine();
    PushItemWidth(80.0f);
    PushAllowKeyboardFocus(false);
    SliderInt("Depth", &g.LogAutoExpandMaxDepth, 0, 9, NULL);
    PopAllowKeyboardFocus();
    PopItemWidth();
    PopID();

    // Start logging at the end of the function so that the buttons don't appear in the log
    if (log_to_tty)
        LogToTTY(g.LogAutoExpandMaxDepth);
    if (log_to_file)
        LogToFile(g.LogAutoExpandMaxDepth, g.IO.LogFilename);
    if (log_to_clipboard)
        LogToClipboard(g.LogAutoExpandMaxDepth);
}